

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_header_procedure
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 type;
  opj_codestream_index_t *cstr_index;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  OPJ_BOOL OVar4;
  OPJ_SIZE_T OVar5;
  opj_stream_read_fn p_Var6;
  OPJ_OFF_T OVar7;
  OPJ_BYTE *new_header_data;
  OPJ_BOOL l_has_qcd;
  OPJ_BOOL l_has_cod;
  OPJ_BOOL l_has_siz;
  opj_dec_memory_marker_handler_t *l_marker_handler;
  OPJ_UINT32 l_marker_size;
  OPJ_UINT32 l_current_marker;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  _l_marker_size = p_manager;
  p_manager_local = (opj_event_mgr_t *)p_stream;
  p_stream_local = (opj_stream_private_t *)p_j2k;
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c0f,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c10,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c11,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  (p_j2k->m_specific_param).m_decoder.m_state = 1;
  OVar4 = opj_j2k_read_soc(p_j2k,p_stream,p_manager);
  if (OVar4 == 0) {
    opj_event_msg(_l_marker_size,1,"Expected a SOC marker \n");
    p_j2k_local._4_4_ = 0;
  }
  else {
    OVar5 = opj_stream_read_data
                      ((opj_stream_private_t *)p_manager_local,(OPJ_BYTE *)p_stream_local->m_read_fn
                       ,2,_l_marker_size);
    if (OVar5 == 2) {
      opj_read_bytes_LE((OPJ_BYTE *)p_stream_local->m_read_fn,
                        (OPJ_UINT32 *)((long)&l_marker_handler + 4),2);
      while (l_marker_handler._4_4_ != 0xff90) {
        if (l_marker_handler._4_4_ < 0xff00) {
          opj_event_msg(_l_marker_size,1,"A marker ID was expected (0xff--) instead of %.8x\n",
                        (ulong)l_marker_handler._4_4_);
          return 0;
        }
        _l_has_cod = opj_j2k_get_marker_handler(l_marker_handler._4_4_);
        if (_l_has_cod->id == 0) {
          OVar4 = opj_j2k_read_unk((opj_j2k_t *)p_stream_local,
                                   (opj_stream_private_t *)p_manager_local,
                                   (OPJ_UINT32 *)((long)&l_marker_handler + 4),_l_marker_size);
          if (OVar4 == 0) {
            opj_event_msg(_l_marker_size,1,"Unknow marker have been detected and generated error.\n"
                         );
            return 0;
          }
          if (l_marker_handler._4_4_ == 0xff90) break;
          _l_has_cod = opj_j2k_get_marker_handler(l_marker_handler._4_4_);
        }
        if (_l_has_cod->id == 0xff51) {
          bVar1 = true;
        }
        if (_l_has_cod->id == 0xff52) {
          bVar2 = true;
        }
        if (_l_has_cod->id == 0xff5c) {
          bVar3 = true;
        }
        if ((*(uint *)&p_stream_local->m_free_user_data_fn & _l_has_cod->states) == 0) {
          opj_event_msg(_l_marker_size,1,"Marker is not compliant with its position\n");
          return 0;
        }
        OVar5 = opj_stream_read_data
                          ((opj_stream_private_t *)p_manager_local,
                           (OPJ_BYTE *)p_stream_local->m_read_fn,2,_l_marker_size);
        if (OVar5 != 2) {
          opj_event_msg(_l_marker_size,1,"Stream too short\n");
          return 0;
        }
        opj_read_bytes_LE((OPJ_BYTE *)p_stream_local->m_read_fn,(OPJ_UINT32 *)&l_marker_handler,2);
        l_marker_handler._0_4_ = (uint)l_marker_handler - 2;
        if (*(uint *)&p_stream_local->m_write_fn < (uint)l_marker_handler) {
          p_Var6 = (opj_stream_read_fn)
                   opj_realloc(p_stream_local->m_read_fn,(ulong)(uint)l_marker_handler);
          if (p_Var6 == (opj_stream_read_fn)0x0) {
            opj_free(p_stream_local->m_read_fn);
            p_stream_local->m_read_fn = (opj_stream_read_fn)0x0;
            *(undefined4 *)&p_stream_local->m_write_fn = 0;
            opj_event_msg(_l_marker_size,1,"Not enough memory to read header\n");
            return 0;
          }
          p_stream_local->m_read_fn = p_Var6;
          *(uint *)&p_stream_local->m_write_fn = (uint)l_marker_handler;
        }
        OVar5 = opj_stream_read_data
                          ((opj_stream_private_t *)p_manager_local,
                           (OPJ_BYTE *)p_stream_local->m_read_fn,(ulong)(uint)l_marker_handler,
                           _l_marker_size);
        if (OVar5 != (uint)l_marker_handler) {
          opj_event_msg(_l_marker_size,1,"Stream too short\n");
          return 0;
        }
        OVar4 = (*_l_has_cod->handler)
                          ((opj_j2k_t *)p_stream_local,(OPJ_BYTE *)p_stream_local->m_read_fn,
                           (uint)l_marker_handler,_l_marker_size);
        if (OVar4 == 0) {
          opj_event_msg(_l_marker_size,1,
                        "Marker handler function failed to read the marker segment\n");
          return 0;
        }
        cstr_index = (opj_codestream_index_t *)p_stream_local[2].m_skip_fn;
        type = _l_has_cod->id;
        OVar7 = opj_stream_tell((opj_stream_private_t *)p_manager_local);
        OVar4 = opj_j2k_add_mhmarker
                          (cstr_index,type,(ulong)(((int)OVar7 - (uint)l_marker_handler) - 4),
                           (uint)l_marker_handler + 4);
        if (OVar4 == 0) {
          opj_event_msg(_l_marker_size,1,"Not enough memory to add mh marker\n");
          return 0;
        }
        OVar5 = opj_stream_read_data
                          ((opj_stream_private_t *)p_manager_local,
                           (OPJ_BYTE *)p_stream_local->m_read_fn,2,_l_marker_size);
        if (OVar5 != 2) {
          opj_event_msg(_l_marker_size,1,"Stream too short\n");
          return 0;
        }
        opj_read_bytes_LE((OPJ_BYTE *)p_stream_local->m_read_fn,
                          (OPJ_UINT32 *)((long)&l_marker_handler + 4),2);
      }
      if (bVar1) {
        if (bVar2) {
          if (bVar3) {
            OVar4 = opj_j2k_merge_ppm((opj_cp_t *)&p_stream_local->m_status,_l_marker_size);
            if (OVar4 == 0) {
              opj_event_msg(_l_marker_size,1,"Failed to merge PPM data\n");
              p_j2k_local._4_4_ = 0;
            }
            else {
              opj_event_msg(_l_marker_size,4,"Main header has been correctly decoded.\n");
              OVar7 = opj_stream_tell((opj_stream_private_t *)p_manager_local);
              *(ulong *)(p_stream_local[2].m_skip_fn + 8) = (ulong)((int)OVar7 - 2);
              *(undefined4 *)&p_stream_local->m_free_user_data_fn = 8;
              p_j2k_local._4_4_ = 1;
            }
          }
          else {
            opj_event_msg(_l_marker_size,1,"required QCD marker not found in main header\n");
            p_j2k_local._4_4_ = 0;
          }
        }
        else {
          opj_event_msg(_l_marker_size,1,"required COD marker not found in main header\n");
          p_j2k_local._4_4_ = 0;
        }
      }
      else {
        opj_event_msg(_l_marker_size,1,"required SIZ marker not found in main header\n");
        p_j2k_local._4_4_ = 0;
      }
    }
    else {
      opj_event_msg(_l_marker_size,1,"Stream too short\n");
      p_j2k_local._4_4_ = 0;
    }
  }
  return p_j2k_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_j2k_read_header_procedure( opj_j2k_t *p_j2k,
                                                                            opj_stream_private_t *p_stream,
                                                                            opj_event_mgr_t * p_manager)
{
        OPJ_UINT32 l_current_marker;
        OPJ_UINT32 l_marker_size;
        const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
        OPJ_BOOL l_has_siz = 0;
        OPJ_BOOL l_has_cod = 0;
        OPJ_BOOL l_has_qcd = 0;

        /* preconditions */
        assert(p_stream != 00);
        assert(p_j2k != 00);
        assert(p_manager != 00);

        /*  We enter in the main header */
        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_MHSOC;

        /* Try to read the SOC marker, the codestream must begin with SOC marker */
        if (! opj_j2k_read_soc(p_j2k,p_stream,p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Expected a SOC marker \n");
                return OPJ_FALSE;
        }

        /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                return OPJ_FALSE;
        }

        /* Read 2 bytes as the new marker ID */
        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);

        /* Try to read until the SOT is detected */
        while (l_current_marker != J2K_MS_SOT) {

                /* Check if the current marker ID is valid */
                if (l_current_marker < 0xff00) {
                        opj_event_msg(p_manager, EVT_ERROR, "A marker ID was expected (0xff--) instead of %.8x\n", l_current_marker);
                        return OPJ_FALSE;
                }

                /* Get the marker handler from the marker ID */
                l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);

                /* Manage case where marker is unknown */
                if (l_marker_handler->id == J2K_MS_UNK) {
                        if (! opj_j2k_read_unk(p_j2k, p_stream, &l_current_marker, p_manager)){
                                opj_event_msg(p_manager, EVT_ERROR, "Unknow marker have been detected and generated error.\n");
                                return OPJ_FALSE;
                        }

                        if (l_current_marker == J2K_MS_SOT)
                                break; /* SOT marker is detected main header is completely read */
                        else    /* Get the marker handler from the marker ID */
                                l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);
                }

                if (l_marker_handler->id == J2K_MS_SIZ) {
                    /* Mark required SIZ marker as found */
                    l_has_siz = 1;
                }
                if (l_marker_handler->id == J2K_MS_COD) {
                    /* Mark required COD marker as found */
                    l_has_cod = 1;
                }
                if (l_marker_handler->id == J2K_MS_QCD) {
                    /* Mark required QCD marker as found */
                    l_has_qcd = 1;
                }

                /* Check if the marker is known and if it is the right place to find it */
                if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
                        opj_event_msg(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
                        return OPJ_FALSE;
                }

                /* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* read 2 bytes as the marker size */
                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);
                l_marker_size -= 2; /* Subtract the size of the marker ID already read */

                /* Check if the marker size is compatible with the header data size */
                if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
                        OPJ_BYTE *new_header_data = (OPJ_BYTE *) opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data, l_marker_size);
                        if (! new_header_data) {
                                opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                                p_j2k->m_specific_param.m_decoder.m_header_data = NULL;
                                p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read header\n");
                                return OPJ_FALSE;
                        }
                        p_j2k->m_specific_param.m_decoder.m_header_data = new_header_data;
                        p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
                }

                /* Try to read the rest of the marker segment from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* Read the marker segment with the correct marker handler */
                if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Marker handler function failed to read the marker segment\n");
                        return OPJ_FALSE;
                }

                /* Add the marker to the codestream index*/
                if (OPJ_FALSE == opj_j2k_add_mhmarker(
                                        p_j2k->cstr_index,
                                        l_marker_handler->id,
                                        (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
                                        l_marker_size + 4 )) {
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to add mh marker\n");
                        return OPJ_FALSE;
                }

                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* read 2 bytes as the new marker ID */
                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
        }

        if (l_has_siz == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required SIZ marker not found in main header\n");
            return OPJ_FALSE;
        }
        if (l_has_cod == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required COD marker not found in main header\n");
            return OPJ_FALSE;
        }
        if (l_has_qcd == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required QCD marker not found in main header\n");
            return OPJ_FALSE;
        }
	
        if (! opj_j2k_merge_ppm(&(p_j2k->m_cp), p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR, "Failed to merge PPM data\n");
            return OPJ_FALSE;
        }

        opj_event_msg(p_manager, EVT_INFO, "Main header has been correctly decoded.\n");

        /* Position of the last element if the main header */
        p_j2k->cstr_index->main_head_end = (OPJ_UINT32) opj_stream_tell(p_stream) - 2;

        /* Next step: read a tile-part header */
        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

        return OPJ_TRUE;
}